

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

void __thiscall
QAssociativeIterable::setValue(QAssociativeIterable *this,QVariant *key,QVariant *mapped)

{
  long lVar1;
  QVariantTypeCoercer *this_00;
  QMetaType value;
  void *key_00;
  QMetaType *in_RDX;
  long in_FS_OFFSET;
  QMetaAssociation meta;
  QVariantTypeCoercer mappedCoercer;
  QVariantTypeCoercer keyCoercer;
  void *in_stack_ffffffffffffff28;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff30;
  QMetaType *in_stack_ffffffffffffff38;
  QVariant *in_stack_ffffffffffffff40;
  QVariantTypeCoercer *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x3341a0);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x3341cb);
  QIterable<QMetaAssociation>::metaContainer(in_stack_ffffffffffffff30);
  QIterable<QMetaAssociation>::mutableIterable((QIterable<QMetaAssociation> *)0x334205);
  QMetaAssociation::keyMetaType((QMetaAssociation *)in_stack_ffffffffffffff30);
  this_00 = (QVariantTypeCoercer *)
            QtPrivate::QVariantTypeCoercer::coerce
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38
                      );
  value = QMetaAssociation::mappedMetaType((QMetaAssociation *)in_stack_ffffffffffffff30);
  key_00 = QtPrivate::QVariantTypeCoercer::coerce(this_00,(QVariant *)value.d_ptr,in_RDX);
  QMetaAssociation::setMappedAtKey
            ((QMetaAssociation *)value.d_ptr,in_RDX,key_00,in_stack_ffffffffffffff28);
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x3342c9);
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x3342d6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAssociativeIterable::setValue(const QVariant &key, const QVariant &mapped)
{
    QtPrivate::QVariantTypeCoercer keyCoercer;
    QtPrivate::QVariantTypeCoercer mappedCoercer;
    QMetaAssociation meta = metaContainer();
    meta.setMappedAtKey(mutableIterable(), keyCoercer.coerce(key, meta.keyMetaType()),
                        mappedCoercer.coerce(mapped, meta.mappedMetaType()));
}